

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_sqlite.cpp
# Opt level: O0

sqlite3_value * duckdb::CastToSQLiteValue::Operation<short>(int16_t input)

{
  sqlite3_value *in_RDI;
  
  OperationInt<short>((short)((ulong)in_RDI >> 0x30));
  return in_RDI;
}

Assistant:

sqlite3_value CastToSQLiteValue::Operation(int16_t input) {
	return OperationInt<int16_t>(input);
}